

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O3

void __thiscall Imf_2_5::FastHufDecoder::buildTables(FastHufDecoder *this,Int64 *base,Int64 *offset)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Int64 IVar4;
  int *piVar5;
  long lVar6;
  InputExc *this_00;
  uint uVar7;
  long lVar8;
  Int64 IVar9;
  long lVar10;
  ulong uVar11;
  
  lVar8 = 0x40;
  lVar6 = 0;
  do {
    lVar10 = *(long *)((long)base + lVar6) << ((byte)lVar8 & 0x3f);
    if (*(long *)((long)base + lVar6) == -1) {
      lVar10 = -1;
    }
    *(long *)((long)this->_ljBase + lVar6) = lVar10;
    lVar6 = lVar6 + 8;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 5);
  IVar4 = this->_ljBase[0];
  this->_ljOffset[0] = *offset - IVar4;
  lVar6 = 0x3f;
  lVar8 = 0;
  do {
    *(ulong *)((long)this->_ljOffset + lVar8 + 8) =
         *(long *)((long)offset + lVar8 + 8) -
         (*(ulong *)((long)this->_ljBase + lVar8 + 8) >> ((byte)lVar6 & 0x3f));
    lVar6 = lVar6 + -1;
    lVar8 = lVar8 + 8;
  } while (lVar6 != 5);
  bVar1 = this->_minCodeLength;
  bVar2 = this->_maxCodeLength;
  iVar3 = this->_numSymbols;
  piVar5 = this->_idToSymbol;
  lVar6 = 0;
  do {
    this->_tableSymbol[lVar6] = 0xffff;
    this->_tableCodeLen[lVar6] = '\0';
    if (bVar1 <= bVar2) {
      uVar11 = (ulong)bVar1;
      do {
        if (this->_ljBase[uVar11] <= (ulong)(lVar6 << 0x34)) {
          this->_tableCodeLen[lVar6] = (uchar)uVar11;
          uVar11 = ((ulong)(lVar6 << 0x34) >> (-(uchar)uVar11 & 0x3f)) + this->_ljOffset[uVar11];
          if ((ulong)(long)iVar3 <= uVar11) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::InputExc::InputExc(this_00,"Huffman decode error (Overrun).");
            __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
          this->_tableSymbol[lVar6] = piVar5[uVar11];
          break;
        }
        uVar11 = uVar11 + 1;
      } while ((ulong)bVar2 + 1 != uVar11);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1000);
  uVar11 = 0xd;
  do {
    uVar7 = (int)uVar11 - 1;
    uVar11 = (ulong)uVar7;
    IVar9 = this->_ljBase[uVar11];
    if (this->_ljBase[uVar11] != 0xffffffffffffffff) break;
    IVar9 = IVar4;
  } while (1 < uVar7);
  this->_tableMin = IVar9;
  return;
}

Assistant:

void
FastHufDecoder::buildTables (Int64 *base, Int64 *offset)
{
    //
    // Build the 'left justified' base table, by shifting base left..
    //

    for (int i = 0; i <= MAX_CODE_LEN; ++i)
    {
        if (base[i] != 0xffffffffffffffffULL)
        {
            _ljBase[i] = base[i] << (64 - i);
        }
        else
        {
            //
            // Unused code length - insert dummy values
            //

            _ljBase[i] = 0xffffffffffffffffULL;
        }
    }

    //
    // Combine some terms into a big fat constant, which for
    // lack of a better term we'll call the 'left justified' 
    // offset table (because it serves the same function
    // as 'offset', when using the left justified base table.
    //

    _ljOffset[0] = offset[0] - _ljBase[0];
    for (int i = 1; i <= MAX_CODE_LEN; ++i)
        _ljOffset[i] = offset[i] - (_ljBase[i] >> (64 - i));

    //
    // Build the acceleration tables for the lookups of
    // short codes ( <= TABLE_LOOKUP_BITS long)
    //

    for (Int64 i = 0; i < 1 << TABLE_LOOKUP_BITS; ++i)
    {
        Int64 value = i << (64 - TABLE_LOOKUP_BITS);

        _tableSymbol[i]  = 0xffff;
        _tableCodeLen[i] = 0; 

        for (int codeLen = _minCodeLength; codeLen <= _maxCodeLength; ++codeLen)
        {
            if (_ljBase[codeLen] <= value)
            {
                _tableCodeLen[i] = codeLen;

                Int64 id = _ljOffset[codeLen] + (value >> (64 - codeLen));
                if (id < static_cast<Int64>(_numSymbols))
                {
                    _tableSymbol[i] = _idToSymbol[id];
                }
                else
                {
                    throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                                   "(Overrun).");
                }
                break;
            }
        }
    }

    //
    // Store the smallest value in the table that points to real data.
    // This should be the entry for the largest length that has 
    // valid data (in our case, non-dummy _ljBase)
    //

    int minIdx = TABLE_LOOKUP_BITS;

    while (minIdx > 0 && _ljBase[minIdx] == 0xffffffffffffffffULL)
        minIdx--;

    if (minIdx < 0)
    {
        //
        // Error, no codes with lengths 0-TABLE_LOOKUP_BITS used.
        // Set the min value such that the table is never tested.
        //

        _tableMin = 0xffffffffffffffffULL;
    }
    else
    {
        _tableMin = _ljBase[minIdx];
    }
}